

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfocusframe.cpp
# Opt level: O0

bool __thiscall QFocusFrame::eventFilter(QFocusFrame *this,QObject *o,QEvent *e)

{
  Type TVar1;
  int iVar2;
  QFocusFramePrivate *this_00;
  QStyle *pQVar3;
  QWidget *in_RDX;
  int __sig;
  QWidget *in_RSI;
  QWidget *pQVar4;
  QWidget *in_RDI;
  QFocusFrame *unaff_retaddr;
  QFocusFramePrivate *in_stack_00000008;
  QWidget *w;
  QFocusFramePrivate *d;
  undefined4 in_stack_ffffffffffffffc8;
  QFocusFramePrivate *in_stack_ffffffffffffffd8;
  QWidget *widget;
  
  pQVar4 = in_RSI;
  widget = in_RDI;
  this_00 = d_func((QFocusFrame *)0x49ce96);
  iVar2 = (int)pQVar4;
  if (in_RSI == this_00->widget) {
    TVar1 = QEvent::type((QEvent *)in_RDX);
    if (TVar1 - Move < 2) {
      QFocusFramePrivate::updateSize(in_stack_00000008);
    }
    else if (TVar1 == Destroy) {
      setWidget(unaff_retaddr,widget);
    }
    else if (TVar1 == Show) {
      QFocusFramePrivate::update(in_stack_ffffffffffffffd8);
      QWidget::show((QWidget *)this_00);
    }
    else {
      if (TVar1 != Hide) {
        if (TVar1 == ParentChange) {
          if ((this_00->showFrameAboveWidget & 1U) != 0) {
            setWidget(unaff_retaddr,widget);
            setWidget(unaff_retaddr,widget);
            return false;
          }
          QFocusFramePrivate::update(in_stack_ffffffffffffffd8);
          return false;
        }
        if (TVar1 == PaletteChange) {
          QWidget::palette(in_RDI);
          QWidget::setPalette(in_RDX,(QPalette *)this_00);
          return false;
        }
        if (TVar1 != StyleChange) {
          if (TVar1 != ZOrderChange) {
            return false;
          }
          pQVar3 = QWidget::style((QWidget *)CONCAT44(0x7e,in_stack_ffffffffffffffc8));
          __sig = 0x4c;
          iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x4c,0,in_RDI);
          if (iVar2 != 0) {
            QWidget::raise(in_RDI,__sig);
            return false;
          }
          QWidget::stackUnder(in_RDX,(QWidget *)in_stack_00000008);
          return false;
        }
      }
      QWidget::hide((QWidget *)0x49cf47);
    }
  }
  else if ((this_00->showFrameAboveWidget & 1U) != 0) {
    TVar1 = QEvent::type((QEvent *)in_RDX);
    if (TVar1 - Move < 2) {
      QFocusFramePrivate::updateSize(in_stack_00000008);
    }
    else if (TVar1 == ZOrderChange) {
      QWidget::raise(in_RDI,iVar2);
    }
  }
  return false;
}

Assistant:

bool
QFocusFrame::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QFocusFrame);
    if (o == d->widget) {
        switch(e->type()) {
        case QEvent::Move:
        case QEvent::Resize:
            d->updateSize();
            break;
        case QEvent::Hide:
        case QEvent::StyleChange:
            hide();
            break;
        case QEvent::ParentChange:
            if (d->showFrameAboveWidget) {
                QWidget *w = d->widget;
                setWidget(nullptr);
                setWidget(w);
            } else {
                d->update();
            }
            break;
        case QEvent::Show:
            d->update();
            show();
            break;
        case QEvent::PaletteChange:
            setPalette(d->widget->palette());
            break;
        case QEvent::ZOrderChange:
            if (style()->styleHint(QStyle::SH_FocusFrame_AboveWidget, nullptr, this))
                raise();
            else
                stackUnder(d->widget);
            break;
        case QEvent::Destroy:
            setWidget(nullptr);
            break;
        default:
            break;
        }
    } else if (d->showFrameAboveWidget) {
        // Handle changes in the parent widgets we are monitoring.
        switch(e->type()) {
        case QEvent::Move:
        case QEvent::Resize:
            d->updateSize();
            break;
        case QEvent::ZOrderChange:
            raise();
            break;
        default:
            break;
        }
    }
    return false;
}